

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  char *pcVar8;
  size_t sVar9;
  uint uVar10;
  char *__s;
  char cVar11;
  char *pcVar12;
  ulong uVar13;
  
  uVar10 = num * 8;
  uVar7 = num * 8 + 3;
  if (this->unknown_ != (string *)0x0) {
    uVar13 = (ulong)uVar7;
    cVar11 = (char)this->unknown_;
    if (0x7f < uVar10) {
      do {
        std::__cxx11::string::push_back(cVar11);
        bVar6 = 0x3fff < uVar13;
        uVar13 = uVar13 >> 7;
      } while (bVar6);
    }
    std::__cxx11::string::push_back(cVar11);
  }
  iVar3 = ctx->depth_;
  ctx->depth_ = iVar3 - 1U;
  if (0 < iVar3) {
    iVar4 = ctx->group_depth_;
    uVar5 = iVar4 + 1;
    pcVar12 = (char *)(ulong)uVar5;
    ctx->group_depth_ = uVar5;
    pcVar8 = WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                       (this,ptr,ctx);
    if (pcVar8 != (char *)0x0) {
      __s = (char *)(ulong)(uint)ctx->depth_;
      if (iVar3 - 1U == ctx->depth_) {
        __s = (char *)(ulong)(uint)ctx->group_depth_;
        if (uVar5 == ctx->group_depth_) {
          ctx->group_depth_ = iVar4;
          ctx->depth_ = iVar3;
          uVar5 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          if (pcVar8 == (char *)0x0) {
            return (char *)0x0;
          }
          if (uVar5 != uVar7) {
            return (char *)0x0;
          }
          if (this->unknown_ == (string *)0x0) {
            return pcVar8;
          }
          uVar13 = (ulong)(uVar10 | 4);
          cVar11 = (char)this->unknown_;
          if (0x7f < uVar10) {
            do {
              std::__cxx11::string::push_back(cVar11);
              bVar6 = 0x3fff < uVar13;
              uVar13 = uVar13 >> 7;
            } while (bVar6);
          }
          std::__cxx11::string::push_back(cVar11);
          return pcVar8;
        }
      }
      else {
        ParseGroup();
      }
      ParseGroup();
      sVar9 = strlen(__s);
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (pcVar12,sVar9,__s);
      return pcVar12;
    }
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
  }
  return (char *)0x0;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroupInlined(ptr, num * 8 + 3, [&](const char* ptr) {
      return WireFormatParser(*this, ptr, ctx);
    });
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }